

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,uint val)

{
  PFNGLUSEPROGRAMPROC p_Var1;
  bool bVar2;
  __type _Var3;
  ProgramHandle PVar4;
  element_type *this_00;
  reference pGVar5;
  invalid_argument *piVar6;
  GLuint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderUniform *u;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  *__range2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  GLuint local_14;
  
  p_Var1 = glad_glUseProgram;
  local_14 = in_EDX;
  this_00 = std::
            __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ec31b);
  PVar4 = GLCompiledProgram::getHandle(this_00);
  (*p_Var1)(PVar4);
  local_20 = in_RDI + 2;
  local_28._M_current =
       (GLShaderUniform *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
       ::begin(in_stack_ffffffffffffff68);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar2) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::invalid_argument::invalid_argument(piVar6,local_68);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pGVar5 = __gnu_cxx::
             __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>_>
             ::operator*(&local_28);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RDI);
    if (_Var3) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>_>
    ::operator++(&local_28);
  }
  if (pGVar5->location != -1) {
    if (pGVar5->type != UInt) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Tried to set GLShaderUniform with wrong type")
      ;
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    (*glad_glUniform1ui)(pGVar5->location,local_14);
    pGVar5->isSet = true;
  }
  return;
}

Assistant:

void GLShaderProgram::setUniform(std::string name, unsigned int val) {
  glUseProgram(compiledProgram->getHandle());

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.location == -1) return;
      if (u.type == RenderDataType::UInt) {
        glUniform1ui(u.location, val);
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}